

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_low1_ssse3(__m128i *input,__m128i *output)

{
  undefined2 uVar1;
  int32_t *piVar2;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m128i _in;
  __m128i _w1;
  __m128i _w0;
  __m128i x [32];
  int32_t *cospi;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  
  piVar2 = cospi_arr(0xc);
  uVar1 = (undefined2)(piVar2[0x20] << 3);
  auVar3._2_2_ = uVar1;
  auVar3._0_2_ = uVar1;
  auVar3._4_2_ = uVar1;
  auVar3._6_2_ = uVar1;
  auVar3._10_2_ = uVar1;
  auVar3._8_2_ = uVar1;
  auVar3._12_2_ = uVar1;
  auVar3._14_2_ = uVar1;
  uVar1 = (undefined2)(piVar2[0x20] << 3);
  auVar4._2_2_ = uVar1;
  auVar4._0_2_ = uVar1;
  auVar4._4_2_ = uVar1;
  auVar4._6_2_ = uVar1;
  auVar4._10_2_ = uVar1;
  auVar4._8_2_ = uVar1;
  auVar4._12_2_ = uVar1;
  auVar4._14_2_ = uVar1;
  auVar3 = pmulhrsw(*in_RDI,auVar3);
  auVar4 = pmulhrsw(*in_RDI,auVar4);
  local_2a8 = auVar3._0_8_;
  uStack_2a0 = auVar3._8_8_;
  *in_RSI = local_2a8;
  in_RSI[1] = uStack_2a0;
  in_RSI[0x7e] = local_2a8;
  in_RSI[0x7f] = uStack_2a0;
  local_298 = auVar4._0_8_;
  uStack_290 = auVar4._8_8_;
  in_RSI[2] = local_298;
  in_RSI[3] = uStack_290;
  in_RSI[0x7c] = local_298;
  in_RSI[0x7d] = uStack_290;
  in_RSI[4] = local_298;
  in_RSI[5] = uStack_290;
  in_RSI[0x7a] = local_298;
  in_RSI[0x7b] = uStack_290;
  in_RSI[6] = local_2a8;
  in_RSI[7] = uStack_2a0;
  in_RSI[0x78] = local_2a8;
  in_RSI[0x79] = uStack_2a0;
  in_RSI[8] = local_2a8;
  in_RSI[9] = uStack_2a0;
  in_RSI[0x76] = local_2a8;
  in_RSI[0x77] = uStack_2a0;
  in_RSI[10] = local_298;
  in_RSI[0xb] = uStack_290;
  in_RSI[0x74] = local_298;
  in_RSI[0x75] = uStack_290;
  in_RSI[0xc] = local_298;
  in_RSI[0xd] = uStack_290;
  in_RSI[0x72] = local_298;
  in_RSI[0x73] = uStack_290;
  in_RSI[0xe] = local_2a8;
  in_RSI[0xf] = uStack_2a0;
  in_RSI[0x70] = local_2a8;
  in_RSI[0x71] = uStack_2a0;
  in_RSI[0x10] = local_2a8;
  in_RSI[0x11] = uStack_2a0;
  in_RSI[0x6e] = local_2a8;
  in_RSI[0x6f] = uStack_2a0;
  in_RSI[0x12] = local_298;
  in_RSI[0x13] = uStack_290;
  in_RSI[0x6c] = local_298;
  in_RSI[0x6d] = uStack_290;
  in_RSI[0x14] = local_298;
  in_RSI[0x15] = uStack_290;
  in_RSI[0x6a] = local_298;
  in_RSI[0x6b] = uStack_290;
  in_RSI[0x16] = local_2a8;
  in_RSI[0x17] = uStack_2a0;
  in_RSI[0x68] = local_2a8;
  in_RSI[0x69] = uStack_2a0;
  in_RSI[0x18] = local_2a8;
  in_RSI[0x19] = uStack_2a0;
  in_RSI[0x66] = local_2a8;
  in_RSI[0x67] = uStack_2a0;
  in_RSI[0x1a] = local_298;
  in_RSI[0x1b] = uStack_290;
  in_RSI[100] = local_298;
  in_RSI[0x65] = uStack_290;
  in_RSI[0x1c] = local_298;
  in_RSI[0x1d] = uStack_290;
  in_RSI[0x62] = local_298;
  in_RSI[99] = uStack_290;
  in_RSI[0x1e] = local_2a8;
  in_RSI[0x1f] = uStack_2a0;
  in_RSI[0x60] = local_2a8;
  in_RSI[0x61] = uStack_2a0;
  in_RSI[0x20] = local_2a8;
  in_RSI[0x21] = uStack_2a0;
  in_RSI[0x5e] = local_2a8;
  in_RSI[0x5f] = uStack_2a0;
  in_RSI[0x22] = local_298;
  in_RSI[0x23] = uStack_290;
  in_RSI[0x5c] = local_298;
  in_RSI[0x5d] = uStack_290;
  in_RSI[0x24] = local_298;
  in_RSI[0x25] = uStack_290;
  in_RSI[0x5a] = local_298;
  in_RSI[0x5b] = uStack_290;
  in_RSI[0x26] = local_2a8;
  in_RSI[0x27] = uStack_2a0;
  in_RSI[0x58] = local_2a8;
  in_RSI[0x59] = uStack_2a0;
  in_RSI[0x28] = local_2a8;
  in_RSI[0x29] = uStack_2a0;
  in_RSI[0x56] = local_2a8;
  in_RSI[0x57] = uStack_2a0;
  in_RSI[0x2a] = local_298;
  in_RSI[0x2b] = uStack_290;
  in_RSI[0x54] = local_298;
  in_RSI[0x55] = uStack_290;
  in_RSI[0x2c] = local_298;
  in_RSI[0x2d] = uStack_290;
  in_RSI[0x52] = local_298;
  in_RSI[0x53] = uStack_290;
  in_RSI[0x2e] = local_2a8;
  in_RSI[0x2f] = uStack_2a0;
  in_RSI[0x50] = local_2a8;
  in_RSI[0x51] = uStack_2a0;
  in_RSI[0x30] = local_2a8;
  in_RSI[0x31] = uStack_2a0;
  in_RSI[0x4e] = local_2a8;
  in_RSI[0x4f] = uStack_2a0;
  in_RSI[0x32] = local_298;
  in_RSI[0x33] = uStack_290;
  in_RSI[0x4c] = local_298;
  in_RSI[0x4d] = uStack_290;
  in_RSI[0x34] = local_298;
  in_RSI[0x35] = uStack_290;
  in_RSI[0x4a] = local_298;
  in_RSI[0x4b] = uStack_290;
  in_RSI[0x36] = local_2a8;
  in_RSI[0x37] = uStack_2a0;
  in_RSI[0x48] = local_2a8;
  in_RSI[0x49] = uStack_2a0;
  in_RSI[0x38] = local_2a8;
  in_RSI[0x39] = uStack_2a0;
  in_RSI[0x46] = local_2a8;
  in_RSI[0x47] = uStack_2a0;
  in_RSI[0x3a] = local_298;
  in_RSI[0x3b] = uStack_290;
  in_RSI[0x44] = local_298;
  in_RSI[0x45] = uStack_290;
  in_RSI[0x3c] = local_298;
  in_RSI[0x3d] = uStack_290;
  in_RSI[0x42] = local_298;
  in_RSI[0x43] = uStack_290;
  in_RSI[0x3e] = local_2a8;
  in_RSI[0x3f] = uStack_2a0;
  in_RSI[0x40] = local_2a8;
  in_RSI[0x41] = uStack_2a0;
  return;
}

Assistant:

static void idct64_low1_ssse3(const __m128i *input, __m128i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);

  // stage 1
  __m128i x[32];
  x[0] = input[0];

  // stage 2
  // stage 3
  // stage 4
  // stage 5
  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);

  // stage 7
  // stage 8
  // stage 9
  // stage 10
  // stage 11
  output[0] = x[0];
  output[63] = x[0];
  output[1] = x[1];
  output[62] = x[1];
  output[2] = x[1];
  output[61] = x[1];
  output[3] = x[0];
  output[60] = x[0];
  output[4] = x[0];
  output[59] = x[0];
  output[5] = x[1];
  output[58] = x[1];
  output[6] = x[1];
  output[57] = x[1];
  output[7] = x[0];
  output[56] = x[0];
  output[8] = x[0];
  output[55] = x[0];
  output[9] = x[1];
  output[54] = x[1];
  output[10] = x[1];
  output[53] = x[1];
  output[11] = x[0];
  output[52] = x[0];
  output[12] = x[0];
  output[51] = x[0];
  output[13] = x[1];
  output[50] = x[1];
  output[14] = x[1];
  output[49] = x[1];
  output[15] = x[0];
  output[48] = x[0];
  output[16] = x[0];
  output[47] = x[0];
  output[17] = x[1];
  output[46] = x[1];
  output[18] = x[1];
  output[45] = x[1];
  output[19] = x[0];
  output[44] = x[0];
  output[20] = x[0];
  output[43] = x[0];
  output[21] = x[1];
  output[42] = x[1];
  output[22] = x[1];
  output[41] = x[1];
  output[23] = x[0];
  output[40] = x[0];
  output[24] = x[0];
  output[39] = x[0];
  output[25] = x[1];
  output[38] = x[1];
  output[26] = x[1];
  output[37] = x[1];
  output[27] = x[0];
  output[36] = x[0];
  output[28] = x[0];
  output[35] = x[0];
  output[29] = x[1];
  output[34] = x[1];
  output[30] = x[1];
  output[33] = x[1];
  output[31] = x[0];
  output[32] = x[0];
}